

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O2

coda_dynamic_type * coda_no_data_singleton(coda_format format)

{
  uint __line;
  coda_mem_special *pcVar1;
  char *__assertion;
  long in_FS_OFFSET;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assertion = "format < num_no_data_singletons";
    __line = 0x3d;
LAB_0015df7e:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                  ,__line,"coda_dynamic_type *coda_no_data_singleton(coda_format)");
  }
  pcVar1 = *(coda_mem_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x60);
  if (pcVar1 == (coda_mem_special *)0x0) {
    pcVar1 = coda_mem_no_data_new(format);
    *(coda_mem_special **)(in_FS_OFFSET + (ulong)format * 8 + -0x60) = pcVar1;
    if (pcVar1 == (coda_mem_special *)0x0) {
      __assertion = "no_data_singleton[format] != NULL";
      __line = 0x41;
      goto LAB_0015df7e;
    }
  }
  return (coda_dynamic_type *)pcVar1;
}

Assistant:

coda_dynamic_type *coda_no_data_singleton(coda_format format)
{
    assert(format < num_no_data_singletons);
    if (no_data_singleton[format] == NULL)
    {
        no_data_singleton[format] = coda_mem_no_data_new(format);
        assert(no_data_singleton[format] != NULL);
    }

    return (coda_dynamic_type *)no_data_singleton[format];
}